

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * fts3HashMalloc(sqlite3_int64 n)

{
  int iVar1;
  void *__s;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    __s = sqlite3Malloc(n);
  }
  else {
    __s = (void *)0x0;
  }
  if (__s != (void *)0x0) {
    memset(__s,0,n);
  }
  return __s;
}

Assistant:

static void *fts3HashMalloc(sqlite3_int64 n){
  void *p = sqlite3_malloc64(n);
  if( p ){
    memset(p, 0, n);
  }
  return p;
}